

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O2

bool __thiscall nuraft::raft_server::check_snapshot_timeout(raft_server *this,ptr<peer> *pp)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  uint64_t uVar5;
  ptr<snapshot_sync_ctx> sync_ctx;
  string local_40;
  
  peer::get_snapshot_sync_ctx((peer *)&sync_ctx);
  if (sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    bVar3 = timer_helper::timeout
                      (&(sync_ctx.
                         super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->timer_);
    if (bVar3) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar4 = (*peVar2->_vptr_logger[7])();
        if (2 < iVar4) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar1 = ((((pp->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->id_;
          uVar5 = timer_helper::get_ms
                            (&(sync_ctx.
                               super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->timer_);
          msg_if_given_abi_cxx11_
                    (&local_40,
                     "snapshot install task for peer %d timed out: %lu ms, reset snapshot sync context %p"
                     ,(ulong)uVar1,uVar5,
                     sync_ctx.
                     super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"check_snapshot_timeout",0x32,&local_40);
          std::__cxx11::string::~string((string *)&local_40);
        }
      }
      bVar3 = true;
      clear_snapshot_sync_ctx
                (this,(pp->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      goto LAB_001c8391;
    }
  }
  bVar3 = false;
LAB_001c8391:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sync_ctx.super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar3;
}

Assistant:

bool raft_server::check_snapshot_timeout(ptr<peer> pp) {
    ptr<snapshot_sync_ctx> sync_ctx = pp->get_snapshot_sync_ctx();
    if (!sync_ctx) return false;

    if ( sync_ctx->get_timer().timeout() ) {
        p_wn("snapshot install task for peer %d timed out: %" PRIu64 " ms, "
             "reset snapshot sync context %p",
             pp->get_id(), sync_ctx->get_timer().get_ms(), sync_ctx.get());
        clear_snapshot_sync_ctx(*pp);
        return true;
    }
    return false;
}